

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_set_name(ggml_tensor *tensor,char *name)

{
  bool bVar1;
  size_t i;
  char *name_local;
  ggml_tensor *tensor_local;
  
  i = 0;
  while( true ) {
    bVar1 = false;
    if (i < 0x3f) {
      bVar1 = name[i] != '\0';
    }
    if (!bVar1) break;
    tensor->name[i] = name[i];
    i = i + 1;
  }
  tensor->name[i] = '\0';
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_set_name(struct ggml_tensor * tensor, const char * name) {
    size_t i;
    for (i = 0; i < sizeof(tensor->name) - 1 && name[i] != '\0'; i++) {
        tensor->name[i] = name[i];
    }
    tensor->name[i] = '\0';
    return tensor;
}